

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_30(QPDF *pdf,char *arg2)

{
  QPDFObjectHandle *this;
  bool bVar1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar2;
  reference pvVar3;
  ostream *poVar4;
  QPDFObjectHandle local_c0;
  undefined1 local_b0 [8];
  string new_contents;
  undefined1 local_80 [8];
  string orig_contents;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> pages;
  QPDF final;
  QPDFWriter w;
  QPDF local_20 [8];
  QPDF encrypted;
  char *arg2_local;
  QPDF *pdf_local;
  
  _encrypted = arg2;
  if (arg2 == (char *)0x0) {
    __assert_fail("arg2 != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x47b,"void test_30(QPDF &, const char *)");
  }
  QPDF::QPDF(local_20);
  QPDF::processFile((char *)local_20,_encrypted);
  QPDFWriter::QPDFWriter((QPDFWriter *)&final,pdf,"b.pdf");
  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&final);
  QPDFWriter::copyEncryptionParameters(&final);
  QPDFWriter::write();
  QPDF::QPDF((QPDF *)&pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  QPDF::processFile((char *)&pages.
                             super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,"b.pdf");
  pvVar2 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
             ((long)&orig_contents.field_2 + 8),pvVar2);
  pvVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                      ((long)&orig_contents.field_2 + 8),0);
  this = (QPDFObjectHandle *)((long)&new_contents.field_2 + 8);
  QPDFObjectHandle::QPDFObjectHandle(this,pvVar3);
  getPageContents_abi_cxx11_((string *)local_80,this);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)((long)&new_contents.field_2 + 8));
  pvVar2 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
             ((long)&orig_contents.field_2 + 8),pvVar2);
  pvVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                      ((long)&orig_contents.field_2 + 8),0);
  QPDFObjectHandle::QPDFObjectHandle(&local_c0,pvVar3);
  getPageContents_abi_cxx11_((string *)local_b0,&local_c0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_c0);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_b0);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"oops -- page contents don\'t match");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"original:\n");
    poVar4 = std::operator<<(poVar4,(string *)local_80);
    poVar4 = std::operator<<(poVar4,"new:\n");
    poVar4 = std::operator<<(poVar4,(string *)local_b0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_80);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
             ((long)&orig_contents.field_2 + 8));
  QPDF::~QPDF((QPDF *)&pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  QPDFWriter::~QPDFWriter((QPDFWriter *)&final);
  QPDF::~QPDF(local_20);
  return;
}

Assistant:

static void
test_30(QPDF& pdf, char const* arg2)
{
    assert(arg2 != nullptr);
    QPDF encrypted;
    encrypted.processFile(arg2, "user");
    QPDFWriter w(pdf, "b.pdf");
    w.setStreamDataMode(qpdf_s_preserve);
    w.copyEncryptionParameters(encrypted);
    w.write();

    // Make sure the contents are actually the same
    QPDF final;
    final.processFile("b.pdf", "user");
    std::vector<QPDFObjectHandle> pages = pdf.getAllPages();
    std::string orig_contents = getPageContents(pages.at(0));
    pages = final.getAllPages();
    std::string new_contents = getPageContents(pages.at(0));
    if (orig_contents != new_contents) {
        std::cout << "oops -- page contents don't match" << std::endl
                  << "original:\n"
                  << orig_contents << "new:\n"
                  << new_contents << std::endl;
    }
}